

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O3

void __thiscall
perfetto::protos::gen::ChromeProcessDescriptor::Serialize
          (ChromeProcessDescriptor *this,Message *msg)

{
  uint8_t *src_begin;
  ulong uVar1;
  
  uVar1 = (this->_has_field_).super__Base_bitset<1UL>._M_w;
  if ((uVar1 & 2) != 0) {
    protozero::Message::AppendVarInt<perfetto::protos::gen::ChromeProcessDescriptor_ProcessType>
              (msg,1,this->process_type_);
    uVar1 = (this->_has_field_).super__Base_bitset<1UL>._M_w;
  }
  if ((uVar1 & 4) != 0) {
    protozero::Message::AppendVarInt<int>(msg,2,this->process_priority_);
    uVar1 = (this->_has_field_).super__Base_bitset<1UL>._M_w;
  }
  if ((uVar1 & 8) != 0) {
    protozero::Message::AppendVarInt<int>(msg,3,this->legacy_sort_index_);
    uVar1 = (this->_has_field_).super__Base_bitset<1UL>._M_w;
  }
  if ((uVar1 & 0x10) != 0) {
    protozero::Message::AppendBytes
              (msg,4,(this->host_app_package_name_)._M_dataplus._M_p,
               (this->host_app_package_name_)._M_string_length);
    uVar1 = (this->_has_field_).super__Base_bitset<1UL>._M_w;
  }
  if ((uVar1 & 0x20) != 0) {
    protozero::Message::AppendVarInt<unsigned_long>(msg,5,this->crash_trace_id_);
  }
  src_begin = (uint8_t *)(this->unknown_fields_)._M_dataplus._M_p;
  protozero::Message::WriteToStream
            (msg,src_begin,src_begin + (this->unknown_fields_)._M_string_length);
  return;
}

Assistant:

void ChromeProcessDescriptor::Serialize(::protozero::Message* msg) const {
  // Field 1: process_type
  if (_has_field_[1]) {
    msg->AppendVarInt(1, process_type_);
  }

  // Field 2: process_priority
  if (_has_field_[2]) {
    msg->AppendVarInt(2, process_priority_);
  }

  // Field 3: legacy_sort_index
  if (_has_field_[3]) {
    msg->AppendVarInt(3, legacy_sort_index_);
  }

  // Field 4: host_app_package_name
  if (_has_field_[4]) {
    msg->AppendString(4, host_app_package_name_);
  }

  // Field 5: crash_trace_id
  if (_has_field_[5]) {
    msg->AppendVarInt(5, crash_trace_id_);
  }

  msg->AppendRawProtoBytes(unknown_fields_.data(), unknown_fields_.size());
}